

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void testing::internal::ShuffleRange<int>
               (Random *random,int begin,int end,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  bool bVar2;
  UInt32 UVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  GTestLog GStack_38;
  GTestLog local_34;
  
  iVar5 = (int)((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  if ((begin < 0) || (iVar5 < begin)) {
    GTestLog::GTestLog(&local_34,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/gtest/src/gtest-internal-inl.h"
                       ,0x13a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition 0 <= begin && begin <= size failed. ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid shuffle range start ",0x1c);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,begin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": must be in range [0, ",0x17);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].",2);
    GTestLog::~GTestLog(&local_34);
  }
  if ((end < begin) || (iVar5 < end)) {
    GTestLog::GTestLog(&GStack_38,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/gtest/src/gtest-internal-inl.h"
                       ,0x13d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition begin <= end && end <= size failed. ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid shuffle range finish ",0x1d);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,end);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": must be in range [",0x14);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,begin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"].",2);
    GTestLog::~GTestLog(&GStack_38);
  }
  if (1 < end - begin) {
    uVar6 = (ulong)(uint)(end - begin);
    do {
      UVar3 = Random::Generate(random,(UInt32)uVar6);
      piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      iVar5 = piVar1[(int)(UVar3 + begin)];
      piVar1[(int)(UVar3 + begin)] = piVar1[(long)begin + (uVar6 - 1)];
      piVar1[(long)begin + (uVar6 - 1)] = iVar5;
      bVar2 = 2 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void ShuffleRange(internal::Random* random, int begin, int end,
                  std::vector<E>* v) {
  const int size = static_cast<int>(v->size());
  GTEST_CHECK_(0 <= begin && begin <= size)
      << "Invalid shuffle range start " << begin << ": must be in range [0, "
      << size << "].";
  GTEST_CHECK_(begin <= end && end <= size)
      << "Invalid shuffle range finish " << end << ": must be in range ["
      << begin << ", " << size << "].";

  // Fisher-Yates shuffle, from
  // http://en.wikipedia.org/wiki/Fisher-Yates_shuffle
  for (int range_width = end - begin; range_width >= 2; range_width--) {
    const int last_in_range = begin + range_width - 1;
    const int selected = begin + random->Generate(range_width);
    std::swap((*v)[selected], (*v)[last_in_range]);
  }
}